

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O0

bool sc_dt::operator<(long u,sc_signed *v)

{
  small_type sVar1;
  int iVar2;
  sc_digit *in_RSI;
  undefined8 in_RDI;
  sc_digit ud [3];
  small_type us;
  sc_digit *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  bool local_1;
  
  iVar2 = (int)((ulong)in_RDI >> 0x20);
  sVar1 = get_sign<long>((long *)in_stack_ffffffffffffffd8);
  from_uint<unsigned_long>(iVar2,in_RSI,CONCAT44(sVar1,in_stack_ffffffffffffffe0));
  if (sVar1 < (int)in_RSI[2]) {
    local_1 = true;
  }
  else if ((int)in_RSI[2] < sVar1) {
    local_1 = false;
  }
  else {
    if (sVar1 == 1) {
      iVar2 = vec_skip_and_cmp(iVar2,in_RSI,1,in_stack_ffffffffffffffd8);
      if (iVar2 < 0) {
        return true;
      }
    }
    else if ((sVar1 == -1) &&
            (iVar2 = vec_skip_and_cmp(iVar2,in_RSI,-1,in_stack_ffffffffffffffd8), 0 < iVar2)) {
      return true;
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
operator<(long u, const sc_signed& v)
{
  CONVERT_LONG(u);

  if (us < v.sgn)
    return true;

  if (us > v.sgn)
    return false;

  // us == v.sgn

  if (us == SC_POS) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) < 0)
      return true;

  }
  else if (us == SC_NEG) {

    if (vec_skip_and_cmp(DIGITS_PER_LONG, ud, v.ndigits, v.digit) > 0)
      return true;

  }

  return false;
}